

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjGen.hh
# Opt level: O0

string * __thiscall
QPDFObjGen::unparse_abi_cxx11_(string *__return_storage_ptr__,QPDFObjGen *this,char separator)

{
  string local_90;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  char local_19;
  QPDFObjGen *pQStack_18;
  char separator_local;
  QPDFObjGen *this_local;
  
  local_19 = separator;
  pQStack_18 = this;
  this_local = (QPDFObjGen *)__return_storage_ptr__;
  std::__cxx11::to_string(&local_60,this->obj);
  std::operator+(&local_40,&local_60,local_19);
  std::__cxx11::to_string(&local_90,this->gen);
  std::operator+(__return_storage_ptr__,&local_40,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string
    unparse(char separator = ',') const
    {
        return std::to_string(obj) + separator + std::to_string(gen);
    }